

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O2

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  uint inputSize;
  tableType_t tableType;
  int iVar1;
  LZ4_stream_t ctxBody;
  
  iVar1 = 0;
  memset(&ctxBody,0,0x4020);
  inputSize = *srcSizePtr;
  if (inputSize < 0x7e000001) {
    iVar1 = inputSize + inputSize / 0xff + 0x10;
  }
  if (targetDstSize < iVar1) {
    if ((int)inputSize < 0x1000b) {
      tableType = byU16;
    }
    else {
      tableType = byU32;
    }
    iVar1 = LZ4_compress_destSize_generic
                      (&ctxBody.internal_donotuse,src,dst,srcSizePtr,targetDstSize,tableType);
  }
  else {
    iVar1 = LZ4_compress_fast_extState(&ctxBody,src,dst,inputSize,targetDstSize,1);
  }
  return iVar1;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOCATOR(1, sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}